

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_block<unsigned_char_*,_1024U> *bucket,
          size_t depth)

{
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *this_00;
  uchar *puVar1;
  vector_block<unsigned_char_*,_1024U> *pvVar2;
  uint uVar3;
  uint j;
  long lVar4;
  uchar **t;
  size_t index;
  ulong uVar5;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  uchar *local_230 [64];
  
  this_00 = (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (*(int *)&(bucket->_index_block).
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(bucket->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x80 - bucket->_left_in_block;
  if ((uVar3 & 0xffffffc0) == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      lVar4 = 0;
      do {
        puVar1 = vector_block<unsigned_char_*,_1024U>::operator[](bucket,lVar4 + uVar5);
        local_230[lVar4] = puVar1;
        if (puVar1 == (uchar *)0x0) goto LAB_00212077;
        abStack_270[lVar4] = puVar1[depth];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
      t = local_230;
      lVar4 = 0;
      do {
        pvVar2 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_bucket
                           (this_00,(uint)abStack_270[lVar4]);
        if (pvVar2 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_block<unsigned char *>]"
                       );
        }
        vector_block<unsigned_char_*,_1024U>::push_back(pvVar2,t);
        lVar4 = lVar4 + 1;
        t = t + 1;
      } while (lVar4 != 0x40);
      uVar5 = uVar5 + 0x40;
    } while (uVar5 < (uVar3 & 0xffffffc0));
  }
  if ((uint)uVar5 < uVar3) {
    index = uVar5 & 0xffffffff;
    do {
      local_230[0] = vector_block<unsigned_char_*,_1024U>::operator[](bucket,index);
      if (local_230[0] == (uchar *)0x0) {
LAB_00212077:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      pvVar2 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_bucket
                         (this_00,(uint)local_230[0][depth]);
      if (pvVar2 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_block<unsigned char *>]"
                     );
      }
      vector_block<unsigned_char_*,_1024U>::push_back(pvVar2,local_230);
      index = index + 1;
    } while (index < uVar3);
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}